

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BarrierCase::~BarrierCase(BarrierCase *this)

{
  BarrierCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BarrierCase_011bf0e8;
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&this->m_program);
  std::__cxx11::string::~string((string *)&this->m_referenceImagePath);
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

BarrierCase (Context& context, const char* name, const char* description, const char* referenceImagePath)
		: TestCase				(context, name, description)
		, m_referenceImagePath	(referenceImagePath)
	{
	}